

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  pointer pnVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  cpp_dec_float<200U,_int,_void> local_1a0;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar21 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x0;
  iVar2 = (x->super_IdxSet).num;
  iVar3 = (y->super_IdxSet).num;
  if (0 < (long)iVar3 && 0 < (long)iVar2) {
    lVar17 = (long)iVar2 + -1;
    lVar15 = (long)iVar3 + -1;
    iVar7 = *(x->super_IdxSet).idx;
    iVar8 = *(y->super_IdxSet).idx;
    iVar18 = 0;
    iVar10 = 0;
    iVar14 = (int)lVar15;
    iVar16 = (int)lVar17;
    if (1 < iVar3 && 1 < iVar2) {
      iVar18 = 0;
      do {
        if (iVar7 == iVar8) {
          lVar19 = (long)iVar7;
          pnVar4 = (x->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = lVar19 * 0x80;
          pnVar11 = pnVar4 + lVar19;
          puVar12 = local_a0;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar12 = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
            puVar12 = puVar12 + (ulong)bVar21 * -2 + 1;
          }
          iVar2 = pnVar4[lVar19].m_backend.exp;
          bVar1 = pnVar4[lVar19].m_backend.neg;
          uVar5._0_4_ = pnVar4[lVar19].m_backend.fpclass;
          uVar5._4_4_ = pnVar4[lVar19].m_backend.prec_elem;
          pnVar4 = (y->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar11 = pnVar4 + lVar19;
          pcVar13 = &local_120;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar13->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
          }
          local_120.exp = pnVar4[lVar19].m_backend.exp;
          local_120.neg = pnVar4[lVar19].m_backend.neg;
          local_120.fpclass = pnVar4[lVar19].m_backend.fpclass;
          local_120.prec_elem = pnVar4[lVar19].m_backend.prec_elem;
          local_1a0.fpclass = cpp_dec_float_finite;
          local_1a0.prec_elem = 0x1c;
          local_1a0.neg = false;
          local_1a0.exp = 0;
          puVar12 = local_a0;
          pcVar13 = &local_1a0;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar13->data)._M_elems[0] = *puVar12;
            puVar12 = puVar12 + (ulong)bVar21 * -2 + 1;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
          }
          local_1a0.exp = iVar2;
          local_1a0.neg = bVar1;
          local_1a0._120_8_ = uVar5;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_1a0,&local_120);
          lVar9 = *(long *)(this + 0x20);
          pcVar13 = &local_1a0;
          puVar12 = (uint *)(lVar9 + lVar20);
          for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
            *puVar12 = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
            puVar12 = puVar12 + (ulong)bVar21 * -2 + 1;
          }
          *(int *)(lVar9 + 0x70 + lVar20) = local_1a0.exp;
          *(bool *)(lVar9 + 0x74 + lVar20) = local_1a0.neg;
          *(undefined8 *)(lVar9 + 0x78 + lVar20) = local_1a0._120_8_;
          lVar9 = (long)iVar10;
          iVar10 = iVar10 + 1;
          iVar7 = (x->super_IdxSet).idx[lVar9 + 1];
LAB_0059dca9:
          lVar9 = (long)iVar18;
          iVar18 = iVar18 + 1;
          iVar8 = (y->super_IdxSet).idx[lVar9 + 1];
        }
        else {
          if (iVar8 <= iVar7) goto LAB_0059dca9;
          lVar9 = (long)iVar10;
          iVar10 = iVar10 + 1;
          iVar7 = (x->super_IdxSet).idx[lVar9 + 1];
        }
      } while ((iVar10 < iVar16) && (iVar18 < iVar14));
    }
    if ((iVar10 < iVar16) && (iVar7 != iVar8)) {
      lVar9 = (long)iVar10;
      do {
        lVar9 = lVar9 + 1;
        iVar7 = (x->super_IdxSet).idx[lVar9];
        if (lVar17 <= lVar9) break;
      } while (iVar7 != iVar8);
    }
    if ((iVar18 < iVar14) && (iVar7 != iVar8)) {
      lVar17 = (long)iVar18;
      do {
        lVar17 = lVar17 + 1;
        iVar8 = (y->super_IdxSet).idx[lVar17];
        if (lVar15 <= lVar17) break;
      } while (iVar7 != iVar8);
    }
    if (iVar7 == iVar8) {
      lVar17 = (long)iVar7;
      pnVar4 = (x->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar17 * 0x80;
      pnVar11 = pnVar4 + lVar17;
      puVar12 = local_a0;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar12 = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        puVar12 = puVar12 + (ulong)bVar21 * -2 + 1;
      }
      iVar2 = pnVar4[lVar17].m_backend.exp;
      bVar1 = pnVar4[lVar17].m_backend.neg;
      uVar6._0_4_ = pnVar4[lVar17].m_backend.fpclass;
      uVar6._4_4_ = pnVar4[lVar17].m_backend.prec_elem;
      pnVar4 = (y->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = pnVar4 + lVar17;
      pcVar13 = &local_120;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
      }
      local_120.exp = pnVar4[lVar17].m_backend.exp;
      local_120.neg = pnVar4[lVar17].m_backend.neg;
      local_120.fpclass = pnVar4[lVar17].m_backend.fpclass;
      local_120.prec_elem = pnVar4[lVar17].m_backend.prec_elem;
      local_1a0.fpclass = cpp_dec_float_finite;
      local_1a0.prec_elem = 0x1c;
      local_1a0.exp = 0;
      local_1a0.neg = false;
      puVar12 = local_a0;
      pcVar13 = &local_1a0;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar13->data)._M_elems[0] = *puVar12;
        puVar12 = puVar12 + (ulong)bVar21 * -2 + 1;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
      }
      local_1a0.exp = iVar2;
      local_1a0.neg = bVar1;
      local_1a0._120_8_ = uVar6;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_1a0,&local_120);
      lVar15 = *(long *)(this + 0x20);
      pcVar13 = &local_1a0;
      puVar12 = (uint *)(lVar15 + lVar9);
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar12 = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
        puVar12 = puVar12 + (ulong)bVar21 * -2 + 1;
      }
      *(int *)(lVar15 + 0x70 + lVar9) = local_1a0.exp;
      *(bool *)(lVar15 + 0x74 + lVar9) = local_1a0.neg;
      *(undefined8 *)(lVar15 + 0x78 + lVar9) = local_1a0._120_8_;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assignPWproduct4setup(const SSVectorBase<S>& x,
      const SSVectorBase<T>& y)
{
   assert(dim() == x.dim());
   assert(x.dim() == y.dim());
   assert(x.isSetup());
   assert(y.isSetup());

   clear();
   setupStatus = false;

   int i = 0;
   int j = 0;
   int n = x.size() - 1;
   int m = y.size() - 1;

   /* both x and y non-zero vectors? */
   if(m >= 0 && n >= 0)
   {
      int xi = x.index(i);
      int yj = y.index(j);

      while(i < n && j < m)
      {
         if(xi == yj)
         {
            VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
            xi = x.index(++i);
            yj = y.index(++j);
         }
         else if(xi < yj)
            xi = x.index(++i);
         else
            yj = y.index(++j);
      }

      /* check (possible) remaining indices */

      while(i < n && xi != yj)
         xi = x.index(++i);

      while(j < m && xi != yj)
         yj = y.index(++j);

      if(xi == yj)
         VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
   }

   setup();

   assert(isConsistent());

   return *this;
}